

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O2

void __thiscall bitdeque<32768>::push_back(bitdeque<32768> *this,bool val)

{
  long in_FS_OFFSET;
  _Elt_pointer local_20;
  
  local_20 = *(_Elt_pointer *)(in_FS_OFFSET + 0x28);
  extend_back(this,1);
  back((bitdeque<32768> *)&stack0xffffffffffffffd0);
  std::bitset<32768UL>::reference::operator=((reference *)&stack0xffffffffffffffd0,val);
  if (*(_Elt_pointer *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void push_back(bool val)
    {
        extend_back(1);
        back() = val;
    }